

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_multiobj.h
# Opt level: O2

bool __thiscall
mp::
MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PrepareMOIteration
          (MOManager<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,function<mp::sol::Status_()> *get_stt,function<mp::Solution_()> *get_sol)

{
  MOManagerStatus MVar1;
  bool bVar2;
  Error *this_00;
  function<mp::Solution_()> local_50;
  function<mp::sol::Status_()> local_30;
  
  MVar1 = this->status_;
  if (MVar1 == RUNNING) {
    std::function<mp::sol::Status_()>::function(&local_30,get_stt);
    std::function<mp::Solution_()>::function(&local_50,get_sol);
    bVar2 = DoPrepareNextMultiobjSolve(this,&local_30,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    std::_Function_base::~_Function_base(&local_30.super__Function_base);
    return bVar2;
  }
  if (MVar1 == NOT_ACTIVE) {
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_00,(CStringRef)0x2af495,-1);
  }
  else {
    if (MVar1 != NOT_SET) {
      return false;
    }
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    Error::Error(this_00,(CStringRef)0x2af46b,-1);
  }
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

bool PrepareMOIteration(
      std::function<sol::Status(void)> get_stt, std::function<Solution(void)> get_sol) {
    switch (status_) {
    case MOManagerStatus::NOT_SET:
      MP_RAISE("FlatConverter: MultiobjManager not set up");
    case MOManagerStatus::NOT_ACTIVE:
      MP_RAISE("FlatConverter: MultiobjManager not running");
    case MOManagerStatus::RUNNING:
      return DoPrepareNextMultiobjSolve(get_stt, get_sol);
    case MOManagerStatus::FINISHED:
      return false;
    }
    return false;
  }